

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O2

LY_ERR ly_parse_instance_predicate
                 (char **pred,size_t limit,LYD_FORMAT format,char **prefix,size_t *prefix_len,
                 char **id,size_t *id_len,char **value,size_t *value_len,char **errmsg)

{
  char cVar1;
  ushort uVar2;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  LY_ERR LVar6;
  ushort **ppuVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ushort *puVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  char *in;
  char **local_50;
  char **local_48;
  size_t local_40;
  size_t *local_38;
  
  pcVar15 = *pred;
  in = pcVar15;
  local_40 = limit;
  if (*pcVar15 != '[') {
    __assert_fail("in[0] == \'[\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/ly_common.c"
                  ,0x362,
                  "LY_ERR ly_parse_instance_predicate(const char **, size_t, LYD_FORMAT, const char **, size_t *, const char **, size_t *, const char **, size_t *, const char **)"
                 );
  }
  *value = (char *)0x0;
  *id = (char *)0x0;
  *prefix = (char *)0x0;
  *value_len = 0;
  *id_len = 0;
  *prefix_len = 0;
  local_50 = prefix;
  local_48 = id;
  local_38 = prefix_len;
  ppuVar7 = __ctype_b_loc();
  uVar13 = 0;
  do {
    uVar14 = uVar13;
    cVar1 = pcVar15[uVar14 + 1];
    uVar2 = (*ppuVar7)[cVar1];
    uVar13 = uVar14 + 1;
  } while ((uVar2 >> 0xd & 1) != 0);
  pcVar12 = pcVar15 + uVar13;
  if ((uVar2 >> 0xb & 1) == 0) {
    if (cVar1 == '-') {
      pcVar15 = "Invalid instance predicate format (negative position or invalid node-identifier).";
    }
    else if (cVar1 == '.') {
      uVar14 = uVar14 + 2;
      *local_48 = pcVar12;
      *id_len = 1;
      bVar3 = true;
LAB_0010f932:
      puVar11 = *ppuVar7;
LAB_0010f939:
      do {
        uVar13 = uVar14;
        uVar14 = uVar13 + 1;
      } while ((*(byte *)((long)puVar11 + (long)pcVar15[uVar13] * 2 + 1) & 0x20) != 0);
      if (pcVar15[uVar13] == '=') {
        do {
          uVar10 = uVar13;
          uVar9 = uVar14;
          cVar1 = pcVar15[uVar10 + 1];
          uVar14 = uVar9 + 1;
          uVar13 = uVar10 + 1;
        } while ((*(byte *)((long)puVar11 + (long)cVar1 * 2 + 1) & 0x20) != 0);
        uVar13 = uVar10 + 2;
        if ((cVar1 == '\"') || (cVar1 == '\'')) {
          *value = pcVar15 + uVar13;
          uVar10 = 0;
          for (pcVar12 = pcVar15;
              (uVar13 < local_40 &&
              ((pcVar12[uVar14] != cVar1 || ((uVar14 != uVar10 && (pcVar12[uVar9] == '\\'))))));
              pcVar12 = pcVar12 + 1) {
            uVar13 = uVar13 + 1;
            uVar10 = uVar10 - 1;
          }
          if (pcVar12[uVar14] == cVar1) {
            *value_len = -uVar10;
            puVar11 = *ppuVar7;
            uVar14 = (uVar14 - uVar10) + 1;
            goto LAB_0010f9ec;
          }
          pcVar15 = "Value is not terminated quoted-string.";
        }
        else {
          pcVar15 = "String value is not quoted.";
        }
        *errmsg = pcVar15;
        LVar6 = LY_EVALID;
        goto LAB_0010fac2;
      }
      if (bVar3) {
        pcVar15 = "Unexpected character instead of \'=\' in leaf-list-predicate.";
      }
      else {
        pcVar15 = "Unexpected character instead of \'=\' in key-predicate.";
      }
    }
    else {
      in = pcVar12;
      LVar6 = ly_parse_nodeid(&in,local_50,local_38,local_48,id_len);
      if (LVar6 == LY_SUCCESS) {
        if ((format != LYD_XML) || (*local_50 != (char *)0x0)) {
          pcVar15 = *pred;
          uVar14 = (long)in - (long)pcVar15;
          bVar3 = false;
          in = pcVar15;
          goto LAB_0010f932;
        }
        pcVar15 = "Missing prefix of a node name.";
      }
      else {
        pcVar15 = "Invalid node-identifier.";
      }
    }
LAB_0010fab7:
    *errmsg = pcVar15;
    LVar6 = LY_EVALID;
  }
  else {
    if (cVar1 == '0') {
      pcVar15 = "The position predicate cannot be zero.";
      goto LAB_0010fab7;
    }
    *value = pcVar12;
    sVar5 = 1;
    do {
      sVar8 = sVar5;
      lVar4 = uVar13 + 1;
      uVar13 = uVar13 + 1;
      sVar5 = sVar8 + 1;
    } while ((*(byte *)((long)*ppuVar7 + (long)pcVar15[lVar4] * 2 + 1) & 8) != 0);
    bVar3 = false;
    *value_len = sVar8;
    puVar11 = *ppuVar7;
    uVar14 = uVar13;
    if ((uVar2 >> 0xb & 1) == 0) goto LAB_0010f939;
LAB_0010f9ec:
    do {
      uVar13 = uVar14;
      uVar14 = uVar13 + 1;
    } while ((*(byte *)((long)puVar11 + (long)pcVar15[uVar13] * 2 + 1) & 0x20) != 0);
    if (pcVar15[uVar13] != ']') {
      if ((uVar2 >> 0xb & 1) == 0) {
        if (bVar3) {
          pcVar15 = "Predicate (leaf-list-predicate) is not terminated by \']\' character.";
        }
        else {
          pcVar15 = "Predicate (key-predicate) is not terminated by \']\' character.";
        }
      }
      else {
        pcVar15 = "Predicate (pos) is not terminated by \']\' character.";
      }
      goto LAB_0010fab7;
    }
    if (uVar14 <= local_40) {
      pcVar15 = pcVar15 + uVar14;
      LVar6 = LY_SUCCESS;
      goto LAB_0010fac6;
    }
    *errmsg = "Predicate is incomplete.";
    *value = (char *)0x0;
    *local_48 = (char *)0x0;
    *local_50 = (char *)0x0;
    *value_len = 0;
    *id_len = 0;
    *local_38 = 0;
    LVar6 = LY_EINVAL;
    uVar13 = local_40;
  }
LAB_0010fac2:
  pcVar15 = in + uVar13;
LAB_0010fac6:
  *pred = pcVar15;
  return LVar6;
}

Assistant:

LY_ERR
ly_parse_instance_predicate(const char **pred, size_t limit, LYD_FORMAT format,
        const char **prefix, size_t *prefix_len, const char **id, size_t *id_len, const char **value, size_t *value_len,
        const char **errmsg)
{
    LY_ERR ret = LY_EVALID;
    const char *in = *pred;
    size_t offset = 1;
    uint8_t expr = 0; /* 0 - position predicate; 1 - leaf-list-predicate; 2 - key-predicate */
    char quot;

    assert(in[0] == '[');

    *prefix = *id = *value = NULL;
    *prefix_len = *id_len = *value_len = 0;

    /* leading *WSP */
    for ( ; isspace(in[offset]); offset++) {}

    if (isdigit(in[offset])) {
        /* pos: "[" *WSP positive-integer-value *WSP "]" */
        if (in[offset] == '0') {
            /* zero */
            *errmsg = "The position predicate cannot be zero.";
            goto error;
        }

        /* positive-integer-value */
        *value = &in[offset++];
        for ( ; isdigit(in[offset]); offset++) {}
        *value_len = &in[offset] - *value;

    } else if (in[offset] == '.') {
        /* leaf-list-predicate: "[" *WSP "." *WSP "=" *WSP quoted-string *WSP "]" */
        *id = &in[offset];
        *id_len = 1;
        offset++;
        expr = 1;
    } else if (in[offset] == '-') {
        /* typically negative value */
        *errmsg = "Invalid instance predicate format (negative position or invalid node-identifier).";
        goto error;
    } else {
        /* key-predicate: "[" *WSP node-identifier *WSP "=" *WSP quoted-string *WSP "]" */
        in = &in[offset];
        if (ly_parse_nodeid(&in, prefix, prefix_len, id, id_len)) {
            *errmsg = "Invalid node-identifier.";
            goto error;
        }
        if ((format == LYD_XML) && !(*prefix)) {
            /* all node names MUST be qualified with explicit namespace prefix */
            *errmsg = "Missing prefix of a node name.";
            goto error;
        }
        offset = in - *pred;
        in = *pred;
        expr = 2;
    }

    if (expr) {
        /*  *WSP "=" *WSP quoted-string *WSP "]" */
        for ( ; isspace(in[offset]); offset++) {}

        if (in[offset] != '=') {
            if (expr == 1) {
                *errmsg = "Unexpected character instead of \'=\' in leaf-list-predicate.";
            } else { /* 2 */
                *errmsg = "Unexpected character instead of \'=\' in key-predicate.";
            }
            goto error;
        }
        offset++;
        for ( ; isspace(in[offset]); offset++) {}

        /* quoted-string */
        quot = in[offset++];
        if ((quot != '\'') && (quot != '\"')) {
            *errmsg = "String value is not quoted.";
            goto error;
        }
        *value = &in[offset];
        for ( ; offset < limit && (in[offset] != quot || (offset && in[offset - 1] == '\\')); offset++) {}
        if (in[offset] == quot) {
            *value_len = &in[offset] - *value;
            offset++;
        } else {
            *errmsg = "Value is not terminated quoted-string.";
            goto error;
        }
    }

    /* *WSP "]" */
    for ( ; isspace(in[offset]); offset++) {}
    if (in[offset] != ']') {
        if (expr == 0) {
            *errmsg = "Predicate (pos) is not terminated by \']\' character.";
        } else if (expr == 1) {
            *errmsg = "Predicate (leaf-list-predicate) is not terminated by \']\' character.";
        } else { /* 2 */
            *errmsg = "Predicate (key-predicate) is not terminated by \']\' character.";
        }
        goto error;
    }
    offset++;

    if (offset <= limit) {
        *pred = &in[offset];
        return LY_SUCCESS;
    }

    /* we read after the limit */
    *errmsg = "Predicate is incomplete.";
    *prefix = *id = *value = NULL;
    *prefix_len = *id_len = *value_len = 0;
    offset = limit;
    ret = LY_EINVAL;

error:
    *pred = &in[offset];
    return ret;
}